

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O0

Pass * wasm::createSSAifyNoMergePass(void)

{
  SSAify *this;
  
  this = (SSAify *)operator_new(0x60);
  SSAify::SSAify(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createSSAifyNoMergePass() { return new SSAify(false); }